

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_go_generator.cc
# Opt level: O0

void __thiscall
t_go_generator::generate_deserialize_set_element
          (t_go_generator *this,ostream *out,t_set *tset,bool declare,string *prefix)

{
  t_type *type;
  ostream *poVar1;
  allocator local_179;
  string local_178;
  string local_158;
  undefined1 local_138 [8];
  t_field felem;
  allocator local_71;
  string local_70;
  undefined1 local_50 [8];
  string elem;
  string *prefix_local;
  bool declare_local;
  t_set *tset_local;
  ostream *out_local;
  t_go_generator *this_local;
  
  elem.field_2._8_8_ = prefix;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_70,"_elem",&local_71);
  t_generator::tmp((string *)local_50,&this->super_t_generator,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  type = t_set::get_elem_type(tset);
  std::__cxx11::string::string((string *)&local_158,(string *)local_50);
  t_field::t_field((t_field *)local_138,type,&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  t_field::set_req((t_field *)local_138,T_OPT_IN_REQ_OUT);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_178,"",&local_179);
  generate_deserialize_field(this,out,(t_field *)local_138,true,&local_178,false,false,false,true);
  std::__cxx11::string::~string((string *)&local_178);
  std::allocator<char>::~allocator((allocator<char> *)&local_179);
  poVar1 = t_generator::indent(&this->super_t_generator,out);
  poVar1 = std::operator<<(poVar1,(string *)prefix);
  poVar1 = std::operator<<(poVar1," = append(");
  poVar1 = std::operator<<(poVar1,(string *)prefix);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = std::operator<<(poVar1,(string *)local_50);
  poVar1 = std::operator<<(poVar1,")");
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  t_field::~t_field((t_field *)local_138);
  std::__cxx11::string::~string((string *)local_50);
  return;
}

Assistant:

void t_go_generator::generate_deserialize_set_element(ostream& out,
                                                      t_set* tset,
                                                      bool declare,
                                                      string prefix) {
  (void)declare;
  string elem = tmp("_elem");
  t_field felem(tset->get_elem_type(), elem);
  felem.set_req(t_field::T_OPT_IN_REQ_OUT);
  generate_deserialize_field(out, &felem, true, "", false, false, false, true);
  indent(out) << prefix << " = append(" << prefix << ", " << elem << ")" << endl;
}